

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

void getPixelColorsRGBA8(uchar *buffer,size_t numpixels,uchar *in,LodePNGColorMode *mode)

{
  uchar uVar1;
  uchar uVar2;
  uint uVar3;
  undefined1 auVar4 [16];
  ulong uVar5;
  size_t sVar6;
  ulong uVar7;
  uchar uVar8;
  uchar uVar9;
  ulong uVar10;
  long lVar11;
  uchar *puVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  uint uVar16;
  undefined1 auVar17 [16];
  
  switch(mode->colortype) {
  case LCT_GREY:
    uVar3 = mode->bitdepth;
    uVar5 = (ulong)uVar3;
    if (uVar5 == 8) {
      if (numpixels != 0) {
        sVar6 = 0;
        auVar17[8] = 0xff;
        auVar17._0_8_ = 0xffffffffffffffff;
        auVar17[9] = 0xff;
        auVar17[10] = 0xff;
        auVar17[0xb] = 0xff;
        auVar17[0xc] = 0xff;
        auVar17[0xd] = 0xff;
        auVar17[0xe] = 0xff;
        auVar17[0xf] = 0xff;
        do {
          auVar4 = vpinsrb_avx(auVar17,(uint)in[sVar6],0);
          auVar4 = vpshufb_avx(auVar4,SUB6416(ZEXT464(0x1000000),0));
          *(int *)buffer = auVar4._0_4_;
          sVar6 = sVar6 + 1;
          buffer = buffer + 4;
        } while (numpixels != sVar6);
      }
      if (numpixels != 0 && mode->key_defined != 0) {
        lVar11 = -numpixels;
        do {
          if (mode->key_r == (uint)buffer[lVar11 * 4]) {
            buffer[lVar11 * 4 + 3] = '\0';
          }
          lVar11 = lVar11 + 1;
        } while (lVar11 != 0);
      }
    }
    else if (uVar3 == 0x10) {
      if (numpixels != 0) {
        uVar3 = mode->key_defined;
        sVar6 = 0;
        do {
          uVar8 = in[sVar6 * 2];
          buffer[sVar6 * 4 + 2] = uVar8;
          buffer[sVar6 * 4 + 1] = uVar8;
          buffer[sVar6 * 4] = uVar8;
          if (uVar3 == 0) {
            uVar8 = 0xff;
          }
          else {
            uVar8 = -((uint)CONCAT11(uVar8,in[sVar6 * 2 + 1]) != mode->key_r);
          }
          buffer[sVar6 * 4 + 3] = uVar8;
          sVar6 = sVar6 + 1;
        } while (numpixels != sVar6);
      }
    }
    else if (numpixels != 0) {
      uVar13 = mode->key_defined;
      sVar6 = 0;
      uVar10 = 0;
      do {
        uVar16 = 0;
        uVar7 = uVar5;
        uVar15 = uVar10;
        if (uVar3 != 0) {
          do {
            uVar16 = (uint)((in[uVar15 >> 3] >> (~(byte)uVar15 & 7) & 1) != 0) + uVar16 * 2;
            uVar7 = uVar7 - 1;
            uVar15 = uVar15 + 1;
          } while (uVar7 != 0);
          uVar10 = uVar10 + uVar5;
        }
        uVar8 = (uchar)((uVar16 * 0xff) / (uint)~(-1 << ((byte)uVar3 & 0x1f)));
        buffer[2] = uVar8;
        buffer[1] = uVar8;
        *buffer = uVar8;
        if (uVar13 == 0) {
          uVar8 = 0xff;
        }
        else {
          uVar8 = -(uVar16 != mode->key_r);
        }
        buffer[3] = uVar8;
        sVar6 = sVar6 + 1;
        buffer = buffer + 4;
      } while (sVar6 != numpixels);
    }
    break;
  case LCT_RGB:
    if (mode->bitdepth == 8) {
      sVar6 = numpixels;
      if (numpixels != 0) {
        do {
          buffer[2] = in[2];
          *(undefined2 *)buffer = *(undefined2 *)in;
          buffer[3] = 0xff;
          buffer = buffer + 4;
          in = in + 3;
          sVar6 = sVar6 - 1;
        } while (sVar6 != 0);
      }
      if (numpixels != 0 && mode->key_defined != 0) {
        lVar11 = -numpixels;
        do {
          if (((mode->key_r == (uint)buffer[lVar11 * 4]) &&
              (mode->key_g == (uint)buffer[lVar11 * 4 + 1])) &&
             (mode->key_b == (uint)buffer[lVar11 * 4 + 2])) {
            buffer[lVar11 * 4 + 3] = '\0';
          }
          lVar11 = lVar11 + 1;
        } while (lVar11 != 0);
      }
    }
    else if (numpixels != 0) {
      uVar3 = mode->key_defined;
      puVar12 = in + 5;
      sVar6 = 0;
      do {
        uVar8 = puVar12[-5];
        buffer[sVar6 * 4] = uVar8;
        uVar1 = puVar12[-3];
        buffer[sVar6 * 4 + 1] = uVar1;
        uVar2 = puVar12[-1];
        buffer[sVar6 * 4 + 2] = uVar2;
        uVar9 = 0xff;
        if (((uVar3 != 0) && ((uint)CONCAT11(uVar8,puVar12[-4]) == mode->key_r)) &&
           ((uint)CONCAT11(uVar1,puVar12[-2]) == mode->key_g)) {
          uVar9 = -((uint)CONCAT11(uVar2,*puVar12) != mode->key_b);
        }
        buffer[sVar6 * 4 + 3] = uVar9;
        sVar6 = sVar6 + 1;
        puVar12 = puVar12 + 6;
      } while (numpixels != sVar6);
    }
    break;
  case LCT_PALETTE:
    uVar3 = mode->bitdepth;
    uVar5 = (ulong)uVar3;
    if (uVar5 == 8) {
      if (numpixels != 0) {
        puVar12 = mode->palette;
        sVar6 = 0;
        do {
          *(undefined4 *)(buffer + sVar6 * 4) = *(undefined4 *)(puVar12 + (ulong)in[sVar6] * 4);
          sVar6 = sVar6 + 1;
        } while (numpixels != sVar6);
      }
    }
    else if (numpixels != 0) {
      puVar12 = mode->palette;
      sVar6 = 0;
      uVar10 = 0;
      do {
        uVar14 = 0;
        uVar7 = uVar10;
        uVar15 = uVar5;
        if (uVar3 != 0) {
          do {
            uVar13 = (uint)((in[uVar7 >> 3] >> (~(byte)uVar7 & 7) & 1) != 0) + (int)uVar14 * 2;
            uVar14 = (ulong)uVar13;
            uVar15 = uVar15 - 1;
            uVar7 = uVar7 + 1;
          } while (uVar15 != 0);
          uVar10 = uVar10 + uVar5;
          uVar14 = (ulong)(uVar13 * 4);
        }
        *(undefined4 *)buffer = *(undefined4 *)(puVar12 + uVar14);
        sVar6 = sVar6 + 1;
        buffer = buffer + 4;
      } while (sVar6 != numpixels);
    }
    break;
  case LCT_GREY_ALPHA:
    if (mode->bitdepth == 8) {
      if (numpixels != 0) {
        sVar6 = 0;
        do {
          auVar17 = vpshufb_avx(ZEXT216(*(ushort *)(in + sVar6 * 2)),SUB6416(ZEXT464(0x1000000),0));
          *(int *)(buffer + sVar6 * 4) = auVar17._0_4_;
          sVar6 = sVar6 + 1;
        } while (numpixels != sVar6);
      }
    }
    else if (numpixels != 0) {
      sVar6 = 0;
      do {
        uVar8 = in[sVar6 * 4];
        buffer[sVar6 * 4 + 2] = uVar8;
        buffer[sVar6 * 4 + 1] = uVar8;
        buffer[sVar6 * 4] = uVar8;
        buffer[sVar6 * 4 + 3] = in[sVar6 * 4 + 2];
        sVar6 = sVar6 + 1;
      } while (numpixels != sVar6);
    }
    break;
  case LCT_RGBA:
    if (mode->bitdepth == 8) {
      if (numpixels << 2 != 0) {
        memcpy(buffer,in,numpixels << 2);
        return;
      }
    }
    else if (numpixels != 0) {
      sVar6 = 0;
      do {
        buffer[sVar6 * 4] = in[sVar6 * 8];
        buffer[sVar6 * 4 + 1] = in[sVar6 * 8 + 2];
        buffer[sVar6 * 4 + 2] = in[sVar6 * 8 + 4];
        buffer[sVar6 * 4 + 3] = in[sVar6 * 8 + 6];
        sVar6 = sVar6 + 1;
      } while (numpixels != sVar6);
    }
  }
  return;
}

Assistant:

static void getPixelColorsRGBA8(unsigned char* LODEPNG_RESTRICT buffer, size_t numpixels,
  const unsigned char* LODEPNG_RESTRICT in,
  const LodePNGColorMode* mode) {
  unsigned num_channels = 4;
  size_t i;
  if (mode->colortype == LCT_GREY) {
    if (mode->bitdepth == 8) {
      for (i = 0; i != numpixels; ++i, buffer += num_channels) {
        buffer[0] = buffer[1] = buffer[2] = in[i];
        buffer[3] = 255;
      }
      if (mode->key_defined) {
        buffer -= numpixels * num_channels;
        for (i = 0; i != numpixels; ++i, buffer += num_channels) {
          if (buffer[0] == mode->key_r) buffer[3] = 0;
        }
      }
    }
    else if (mode->bitdepth == 16) {
      for (i = 0; i != numpixels; ++i, buffer += num_channels) {
        buffer[0] = buffer[1] = buffer[2] = in[i * 2];
        buffer[3] = mode->key_defined && 256U * in[i * 2 + 0] + in[i * 2 + 1] == mode->key_r ? 0 : 255;
      }
    }
    else {
      unsigned highest = ((1U << mode->bitdepth) - 1U); /*highest possible value for this bit depth*/
      size_t j = 0;
      for (i = 0; i != numpixels; ++i, buffer += num_channels) {
        unsigned value = readBitsFromReversedStream(&j, in, mode->bitdepth);
        buffer[0] = buffer[1] = buffer[2] = (value * 255) / highest;
        buffer[3] = mode->key_defined && value == mode->key_r ? 0 : 255;
      }
    }
  }
  else if (mode->colortype == LCT_RGB) {
    if (mode->bitdepth == 8) {
      for (i = 0; i != numpixels; ++i, buffer += num_channels) {
        lodepng_memcpy(buffer, &in[i * 3], 3);
        buffer[3] = 255;
      }
      if (mode->key_defined) {
        buffer -= numpixels * num_channels;
        for (i = 0; i != numpixels; ++i, buffer += num_channels) {
          if (buffer[0] == mode->key_r && buffer[1] == mode->key_g && buffer[2] == mode->key_b) buffer[3] = 0;
        }
      }
    }
    else {
      for (i = 0; i != numpixels; ++i, buffer += num_channels) {
        buffer[0] = in[i * 6 + 0];
        buffer[1] = in[i * 6 + 2];
        buffer[2] = in[i * 6 + 4];
        buffer[3] = mode->key_defined
          && 256U * in[i * 6 + 0] + in[i * 6 + 1] == mode->key_r
          && 256U * in[i * 6 + 2] + in[i * 6 + 3] == mode->key_g
          && 256U * in[i * 6 + 4] + in[i * 6 + 5] == mode->key_b ? 0 : 255;
      }
    }
  }
  else if (mode->colortype == LCT_PALETTE) {
    if (mode->bitdepth == 8) {
      for (i = 0; i != numpixels; ++i, buffer += num_channels) {
        unsigned index = in[i];
        /*out of bounds of palette not checked: see lodepng_color_mode_alloc_palette.*/
        lodepng_memcpy(buffer, &mode->palette[index * 4], 4);
      }
    }
    else {
      size_t j = 0;
      for (i = 0; i != numpixels; ++i, buffer += num_channels) {
        unsigned index = readBitsFromReversedStream(&j, in, mode->bitdepth);
        /*out of bounds of palette not checked: see lodepng_color_mode_alloc_palette.*/
        lodepng_memcpy(buffer, &mode->palette[index * 4], 4);
      }
    }
  }
  else if (mode->colortype == LCT_GREY_ALPHA) {
    if (mode->bitdepth == 8) {
      for (i = 0; i != numpixels; ++i, buffer += num_channels) {
        buffer[0] = buffer[1] = buffer[2] = in[i * 2 + 0];
        buffer[3] = in[i * 2 + 1];
      }
    }
    else {
      for (i = 0; i != numpixels; ++i, buffer += num_channels) {
        buffer[0] = buffer[1] = buffer[2] = in[i * 4 + 0];
        buffer[3] = in[i * 4 + 2];
      }
    }
  }
  else if (mode->colortype == LCT_RGBA) {
    if (mode->bitdepth == 8) {
      lodepng_memcpy(buffer, in, numpixels * 4);
    }
    else {
      for (i = 0; i != numpixels; ++i, buffer += num_channels) {
        buffer[0] = in[i * 8 + 0];
        buffer[1] = in[i * 8 + 2];
        buffer[2] = in[i * 8 + 4];
        buffer[3] = in[i * 8 + 6];
      }
    }
  }
}